

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,Allocator *allocator)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  iVar6 = this->c;
  if (this->h * this->w * iVar6 == _w) {
    iVar1 = this->dims;
    if ((iVar1 == 3) && (this->cstep != (long)this->h * (long)this->w)) {
      sVar3 = this->elemsize;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = sVar3;
      __return_storage_ptr__->allocator = allocator;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)_w;
      if (_w == 0) {
        pvVar4 = (void *)0x0;
      }
      else {
        uVar7 = sVar3 * (long)_w + 3 & 0xfffffffffffffffc;
        if (allocator == (Allocator *)0x0) {
          pvVar5 = malloc(uVar7 + 0x1c);
          pvVar4 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar4 + -8) = pvVar5;
        }
        else {
          pvVar4 = (void *)(*(code *)**(undefined8 **)allocator)(allocator,uVar7 + 4);
        }
        __return_storage_ptr__->data = pvVar4;
        __return_storage_ptr__->refcount = (int *)((long)pvVar4 + uVar7);
        *(undefined4 *)((long)pvVar4 + uVar7) = 1;
        iVar6 = this->c;
      }
      if (0 < iVar6) {
        lVar8 = 0;
        do {
          sVar3 = this->elemsize;
          iVar6 = this->h * this->w;
          memcpy((void *)((long)((int)lVar8 * iVar6) * sVar3 + (long)pvVar4),
                 (void *)(this->cstep * lVar8 * sVar3 + (long)this->data),(long)iVar6 * sVar3);
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->c);
      }
    }
    else {
      __return_storage_ptr__->data = this->data;
      piVar2 = this->refcount;
      __return_storage_ptr__->refcount = piVar2;
      __return_storage_ptr__->elemsize = this->elemsize;
      __return_storage_ptr__->allocator = this->allocator;
      __return_storage_ptr__->dims = iVar1;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)_w;
    }
  }
  else {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, Allocator* allocator) const
{
    if (w * h * c != _w)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, elemsize, allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 1;
    m.w = _w;
    m.h = 1;
    m.c = 1;

    m.cstep = _w;

    return m;
}